

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

FUNCTION_RETURN
license::os::getAdapterInfos
          (vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
           *adapterInfos)

{
  short sVar1;
  char *szptr;
  long lVar2;
  iterator __position;
  double dVar3;
  int iVar4;
  size_t sVar5;
  iterator iVar6;
  mapped_type *__dest;
  int *piVar7;
  FUNCTION_RETURN FVar8;
  long lVar9;
  __node_base _Var10;
  long *plVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  ifaddrs *ifaddr;
  string if_name;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
  adapterByName;
  OsAdapterInfo newAdapter;
  long *local_4b0;
  vector<license::os::OsAdapterInfo,std::allocator<license::os::OsAdapterInfo>> *local_4a8;
  key_type local_4a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_480;
  undefined1 local_444 [4];
  char local_440 [1040];
  
  local_480._M_buckets = &local_480._M_single_bucket;
  local_480._M_bucket_count = 1;
  local_480._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_480._M_element_count = 0;
  local_480._M_rehash_policy._M_max_load_factor = 1.0;
  local_480._M_rehash_policy._M_next_resize = 0;
  local_480._M_single_bucket = (__node_base_ptr)0x0;
  iVar4 = getifaddrs(&local_4b0);
  if (iVar4 == -1) {
    piVar7 = __errno_location();
    uVar12 = extraout_XMM0_Da_00;
    uVar13 = extraout_XMM0_Db_00;
    if (*piVar7 != 0) {
      strerror(*piVar7);
      uVar12 = extraout_XMM0_Da_01;
      uVar13 = extraout_XMM0_Db_01;
    }
    FVar8 = FUNC_RET_ERROR;
    _log((double)CONCAT44(uVar13,uVar12));
  }
  else {
    if (local_4b0 == (long *)0x0) {
      local_4b0 = (long *)0x0;
    }
    else {
      plVar11 = local_4b0;
      local_4a8 = (vector<license::os::OsAdapterInfo,std::allocator<license::os::OsAdapterInfo>> *)
                  adapterInfos;
      do {
        if ((plVar11[3] != 0) && ((*(byte *)(plVar11 + 2) & 8) == 0)) {
          szptr = (char *)plVar11[1];
          sVar5 = mstrnlen_s(szptr,0x401);
          local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,szptr,szptr + sVar5);
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&local_480,&local_4a0);
          if (iVar6.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
              ._M_cur == (__node_type *)0x0) {
            memset(local_444,0,0x414);
            mstrlcpy(local_440,(char *)plVar11[1],0x401);
            __dest = std::__detail::
                     _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&local_480,&local_4a0);
            memcpy(__dest,local_444,0x414);
          }
          iVar6 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&local_480,&local_4a0);
          sVar1 = *(short *)plVar11[3];
          dVar3 = _log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
          uVar12 = SUB84(dVar3,0);
          uVar13 = (undefined4)((ulong)dVar3 >> 0x20);
          if (sVar1 == 2) {
            *(undefined4 *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                    ._M_cur + 0x434) = *(undefined4 *)(plVar11[3] + 4);
          }
          else if ((sVar1 == 0x11) && (plVar11[6] != 0)) {
            lVar2 = plVar11[3];
            lVar9 = 0;
            do {
              *(undefined1 *)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                      ._M_cur + 0x42e + lVar9) = *(undefined1 *)(lVar2 + 0xc + lVar9);
              dVar3 = _log((double)CONCAT44(uVar13,uVar12));
              uVar12 = SUB84(dVar3,0);
              uVar13 = (undefined4)((ulong)dVar3 >> 0x20);
              lVar9 = lVar9 + 1;
            } while (lVar9 != 6);
            _log(dVar3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
            operator_delete(local_4a0._M_dataplus._M_p);
          }
        }
        plVar11 = (long *)*plVar11;
        adapterInfos = (vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
                        *)local_4a8;
      } while (plVar11 != (long *)0x0);
    }
    freeifaddrs(local_4b0);
    if (local_480._M_element_count == 0) {
      FVar8 = FUNC_RET_NOT_AVAIL;
    }
    else {
      std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::reserve
                (adapterInfos,local_480._M_element_count);
      FVar8 = FUNC_RET_OK;
      for (_Var10._M_nxt = local_480._M_before_begin._M_nxt; _Var10._M_nxt != (_Hash_node_base *)0x0
          ; _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
        __position._M_current = *(anon_struct_1044_5_0902c47b **)((long)adapterInfos + 8);
        if (__position._M_current == *(anon_struct_1044_5_0902c47b **)((long)adapterInfos + 0x10)) {
          std::vector<license::os::OsAdapterInfo,std::allocator<license::os::OsAdapterInfo>>::
          _M_realloc_insert<license::os::OsAdapterInfo_const&>
                    ((vector<license::os::OsAdapterInfo,std::allocator<license::os::OsAdapterInfo>>
                      *)adapterInfos,__position,
                     (anon_struct_1044_5_0902c47b_for_second *)(_Var10._M_nxt + 5));
        }
        else {
          memcpy(__position._M_current,(anon_struct_1044_5_0902c47b_for_second *)(_Var10._M_nxt + 5)
                 ,0x414);
          *(long *)((long)adapterInfos + 8) = *(long *)((long)adapterInfos + 8) + 0x414;
        }
      }
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_480);
  return FVar8;
}

Assistant:

FUNCTION_RETURN getAdapterInfos(vector<OsAdapterInfo> &adapterInfos) {
	unordered_map<string, OsAdapterInfo> adapterByName;

	FUNCTION_RETURN f_return = FUNC_RET_OK;
	struct ifaddrs *ifaddr, *ifa;
	int family, n = 0;
	unsigned int if_num;

	if (getifaddrs(&ifaddr) == -1) {
		LOG_WARN("getifaddrs failed == -1");
		return FUNC_RET_ERROR;
	}

	for (ifa = ifaddr, n = 0, if_num = 0; ifa != NULL; ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL || (ifa->ifa_flags & IFF_LOOPBACK) != 0) {
			continue;
		}
		string if_name(ifa->ifa_name, mstrnlen_s(ifa->ifa_name, LCC_ADAPTER_DESCRIPTION_LEN));
		// if_name_position = ifname_position(ifnames, ifa->ifa_name, if_num);
		// interface name not seen en advance
		OsAdapterInfo *currentAdapter;
		if (adapterByName.find(if_name) == adapterByName.end()) {
			OsAdapterInfo newAdapter;
			memset(&newAdapter, 0, sizeof(OsAdapterInfo));
			mstrlcpy(&newAdapter.description[0], ifa->ifa_name, LCC_ADAPTER_DESCRIPTION_LEN);
			adapterByName[if_name] = newAdapter;
		}
		auto it = adapterByName.find(if_name);
		currentAdapter = &it->second;
		family = ifa->ifa_addr->sa_family;
		/* Display interface name and family (including symbolic
		 form of the latter for the common families) */
		LOG_DEBUG("%-8s %s (%d)\n", ifa->ifa_name,
				  (family == AF_PACKET) ? "AF_PACKET"
										: (family == AF_INET) ? "AF_INET" : (family == AF_INET6) ? "AF_INET6" : "???",
				  family);
		/* For an AF_INET* interface address, display the address
		 * || family == AF_INET6*/
		if (family == AF_INET) {
			struct sockaddr_in *s1 = (struct sockaddr_in *)ifa->ifa_addr;
			in_addr_t iaddr = s1->sin_addr.s_addr;
			currentAdapter->ipv4_address[0] = (iaddr & 0x000000ff);
			currentAdapter->ipv4_address[1] = (iaddr & 0x0000ff00) >> 8;
			currentAdapter->ipv4_address[2] = (iaddr & 0x00ff0000) >> 16;
			currentAdapter->ipv4_address[3] = (iaddr & 0xff000000) >> 24;

		} else if (family == AF_PACKET && ifa->ifa_data != NULL) {
			struct sockaddr_ll *s1 = (struct sockaddr_ll *)ifa->ifa_addr;
			int i;
			for (i = 0; i < 6; i++) {
				currentAdapter->mac_address[i] = s1->sll_addr[i];
				LOG_DEBUG("%02x:", s1->sll_addr[i]);
			}
			LOG_DEBUG("\t %s\n", ifa->ifa_name);
		}
	}
	freeifaddrs(ifaddr);

	// FIXME sort by eth , enps, wlan
	if (adapterByName.size() == 0) {
		f_return = FUNC_RET_NOT_AVAIL;
	} else {
		f_return = FUNC_RET_OK;
		adapterInfos.reserve(adapterByName.size());
		for (auto &it : adapterByName) {
			adapterInfos.push_back(it.second);
		}
	}
	return f_return;
}